

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_builder.c
# Opt level: O0

TableCells * get_table_cells(Token_conflict *token)

{
  wchar_t wVar1;
  Location_conflict location_00;
  TableCells *pTVar2;
  TableCell *pTVar3;
  TableCell *from_table_cell;
  wchar_t local_24;
  wchar_t i;
  Location location;
  TableCells *table_cells;
  Token_conflict *token_local;
  
  pTVar2 = (TableCells *)malloc(0x10);
  pTVar2->cell_count = token->matched_items->count;
  pTVar2->table_cells = (TableCell *)0x0;
  if (L'\0' < pTVar2->cell_count) {
    pTVar3 = (TableCell *)malloc((long)pTVar2->cell_count << 5);
    pTVar2->table_cells = pTVar3;
    wVar1 = (token->location).line;
    for (local_24 = L'\0'; local_24 < pTVar2->cell_count; local_24 = local_24 + L'\x01') {
      pTVar3 = pTVar2->table_cells;
      location_00.column = token->matched_items->items[local_24].column;
      location_00.line = wVar1;
      from_table_cell = TableCell_new(location_00,token->matched_items->items[local_24].text);
      TableCell_transfer(pTVar3 + local_24,from_table_cell);
    }
  }
  return pTVar2;
}

Assistant:

static const TableCells* get_table_cells(Token* token) {
    TableCells* table_cells = (TableCells*)malloc(sizeof(TableCells));
    table_cells->cell_count = token->matched_items->count;
    table_cells->table_cells = 0;
    if (table_cells->cell_count > 0) {
        table_cells->table_cells = (TableCell*)malloc(table_cells->cell_count * sizeof(TableCell));
        Location location;
        location.line = token->location.line;
        int i;
        for (i = 0; i < table_cells->cell_count; ++i) {
            location.column = token->matched_items->items[i].column;
            TableCell_transfer(&table_cells->table_cells[i], (TableCell*)TableCell_new(location, token->matched_items->items[i].text));
        }
    }
    return table_cells;
}